

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::Matchers::Detail::finalizeDescription(string *desc)

{
  ulong uVar1;
  string *in_RDI;
  undefined8 in_stack_ffffffffffffffa0;
  string *__lhs;
  string local_48 [24];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  __lhs = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::operator+(__lhs,(char)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    std::__cxx11::string::~string(local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  return in_RDI;
}

Assistant:

std::string Catch::Matchers::Detail::finalizeDescription(const std::string& desc) {
    if (desc.empty()) {
        return "matches undescribed predicate";
    } else {
        return "matches predicate: \"" + desc + '"';
    }
}